

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O0

int __thiscall asmjit::v1_14::FuncFrame::init(FuncFrame *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  RegGroup group;
  Iterator __end2;
  Iterator __begin2;
  RegGroupVirtValues *__range2;
  uint32_t minDynamicAlignment;
  uint32_t naturalStackAlignment;
  ArchTraits *archTraits;
  Arch arch;
  RegGroup *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  RegMask in_stack_fffffffffffffe28;
  RegMask in_stack_fffffffffffffe2c;
  uint local_1cc;
  bool local_1b2;
  uint local_1b0;
  char local_1ac;
  char local_1ab;
  char local_1aa;
  undefined1 local_1a9;
  undefined1 *local_1a8;
  undefined4 local_19c;
  uint local_198;
  uint local_194;
  byte *local_190;
  EVP_PKEY_CTX local_181;
  EVP_PKEY_CTX *local_180;
  FuncFrame *local_178;
  Error local_16c;
  EVP_PKEY_CTX *local_168;
  EVP_PKEY_CTX *local_150;
  EVP_PKEY_CTX *local_148;
  EVP_PKEY_CTX local_13e;
  EVP_PKEY_CTX local_13d;
  undefined4 local_13c;
  undefined1 local_138;
  undefined1 local_137;
  undefined1 local_136;
  undefined1 local_135;
  undefined1 local_134;
  undefined1 local_133;
  undefined1 local_132;
  undefined1 local_131;
  undefined1 local_130;
  undefined1 local_12f;
  undefined2 local_12e;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined1 auStack_10c [16];
  undefined1 auStack_fc [16];
  undefined1 auStack_ec [4];
  undefined1 auStack_e8 [4];
  undefined2 local_e4;
  undefined2 local_e2;
  undefined4 local_e0;
  undefined4 local_dc;
  FuncFrame *local_d8;
  byte *local_d0;
  byte *local_c8;
  EVP_PKEY_CTX *local_c0;
  undefined4 *local_b8;
  uint *local_b0;
  EVP_PKEY_CTX *local_a8;
  EVP_PKEY_CTX *local_a0;
  undefined4 local_94;
  EVP_PKEY_CTX *local_90;
  EVP_PKEY_CTX *local_88;
  undefined1 *local_80;
  undefined1 local_71;
  undefined1 *local_70;
  undefined1 local_61;
  char *local_60;
  char *local_58;
  char *local_50;
  char local_41;
  EVP_PKEY_CTX *local_40;
  char *local_38;
  uint *local_30;
  EVP_PKEY_CTX *local_28;
  EVP_PKEY_CTX *local_20;
  undefined4 local_14;
  EVP_PKEY_CTX *local_10;
  uint *local_8;
  
  local_181 = *ctx;
  local_1b2 = local_181 == (EVP_PKEY_CTX)0x0 || 0x10 < (byte)local_181;
  local_180 = ctx;
  local_178 = this;
  local_168 = ctx;
  local_148 = ctx;
  local_13e = local_181;
  if (local_1b2) {
    local_16c = DebugUtils::errored(4);
  }
  else {
    local_190 = _archTraits + (ulong)(byte)local_181 * 0xd8;
    local_13c = 0;
    local_138 = 0;
    local_137 = 0xff;
    local_136 = 0xff;
    local_135 = 0;
    local_134 = 0;
    local_133 = 0;
    local_132 = 0;
    local_131 = 0;
    local_130 = 0;
    local_12f = 0;
    local_12e = 0;
    local_12c = 0;
    local_128 = 0;
    local_124 = 0;
    local_120 = 0;
    local_11c = 0;
    local_118 = 0;
    local_114 = 0;
    local_110 = 0;
    local_13d = local_181;
    local_d8 = this;
    memset(auStack_10c,0,0x10);
    memset(auStack_fc,0,0x10);
    memset(auStack_ec,0,4);
    memset(auStack_e8,0,4);
    local_e4 = 0;
    local_e2 = 0;
    local_e0 = 0;
    local_dc = 0;
    memcpy(this,&local_13c,100);
    this->_arch = (Arch)local_181;
    local_c8 = local_190;
    this->_spRegId = *local_190;
    this->_saRegId = 0xff;
    local_150 = local_180;
    local_c0 = local_180;
    local_194 = (uint)(byte)local_180[5];
    local_19c = 0x10;
    local_b0 = &local_194;
    local_b8 = &local_19c;
    local_1cc = local_194;
    if (local_194 < 0x10) {
      local_1cc = 0x10;
    }
    local_198 = local_1cc;
    if (local_1cc == local_194) {
      local_198 = local_1cc << 1;
    }
    this->_naturalStackAlignment = (uint8_t)local_180[5];
    this->_minDynamicAlignment = (uint8_t)local_198;
    local_a8 = local_180;
    local_28 = local_180;
    this->_redZoneSize = (uint8_t)local_180[3];
    local_a0 = local_180;
    local_20 = local_180;
    this->_spillZoneSize = (uint8_t)local_180[4];
    this->_finalStackAlignment = this->_naturalStackAlignment;
    local_90 = local_180;
    local_94 = 1;
    local_10 = local_180;
    local_14 = 1;
    bVar1 = Support::test<asmjit::v1_14::CallConvFlags,asmjit::v1_14::CallConvFlags>
                      (*(CallConvFlags *)(local_180 + 8),kCalleePopsStack);
    if (bVar1) {
      local_88 = local_180;
      this->_calleeStackCleanup = (uint16_t)*(undefined4 *)(local_180 + 0x88);
    }
    local_1a8 = &local_1a9;
    local_71 = 0;
    local_1aa = '\0';
    local_61 = 4;
    local_1ab = '\x04';
    local_80 = local_1a8;
    local_70 = local_1a8;
    while( true ) {
      local_58 = &local_1aa;
      local_60 = &local_1ab;
      if (local_1aa == local_1ab) break;
      local_50 = &local_1aa;
      local_1ac = local_1aa;
      in_stack_fffffffffffffe28 =
           FuncDetail::usedRegs
                     ((FuncDetail *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                      (RegGroup)((uint)in_stack_fffffffffffffe24 >> 0x18));
      puVar4 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                         ((Array<unsigned_int,_4UL> *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          in_stack_fffffffffffffe18);
      *puVar4 = in_stack_fffffffffffffe28;
      local_40 = local_180;
      local_41 = local_1ac;
      in_stack_fffffffffffffe2c =
           CallConv::preservedRegs
                     ((CallConv *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                      (RegGroup)((uint)in_stack_fffffffffffffe24 >> 0x18));
      puVar4 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                         ((Array<unsigned_int,_4UL> *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          in_stack_fffffffffffffe18);
      *puVar4 = in_stack_fffffffffffffe2c;
      local_38 = &local_1aa;
      local_1aa = local_1aa + '\x01';
    }
    local_d0 = local_190;
    local_1b0 = (uint)*local_190;
    local_30 = &local_1b0;
    uVar2 = 1 << (*local_190 & 0x1f);
    uVar3 = uVar2 ^ 0xffffffff;
    local_8 = local_30;
    puVar4 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       ((Array<unsigned_int,_4UL> *)
                        (CONCAT44(uVar2,in_stack_fffffffffffffe20) ^ 0xffffffff00000000),
                        in_stack_fffffffffffffe18);
    *puVar4 = uVar3 & *puVar4;
    *(undefined4 *)(this->_saveRestoreRegSize)._data = *(undefined4 *)(local_180 + 0xc);
    *(undefined4 *)(this->_saveRestoreAlignment)._data = *(undefined4 *)(local_180 + 0x10);
    local_16c = 0;
  }
  return local_16c;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncFrame::init(const FuncDetail& func) noexcept {
  Arch arch = func.callConv().arch();
  if (!Environment::isValidArch(arch))
    return DebugUtils::errored(kErrorInvalidArch);

  const ArchTraits& archTraits = ArchTraits::byArch(arch);

  // Initializing FuncFrame means making a copy of some properties of `func`. Properties like `_localStackSize` will
  // be set by the user before the frame is finalized.
  reset();

  _arch = arch;
  _spRegId = uint8_t(archTraits.spRegId());
  _saRegId = uint8_t(BaseReg::kIdBad);

  uint32_t naturalStackAlignment = func.callConv().naturalStackAlignment();
  uint32_t minDynamicAlignment = Support::max<uint32_t>(naturalStackAlignment, 16);

  if (minDynamicAlignment == naturalStackAlignment)
    minDynamicAlignment <<= 1;

  _naturalStackAlignment = uint8_t(naturalStackAlignment);
  _minDynamicAlignment = uint8_t(minDynamicAlignment);
  _redZoneSize = uint8_t(func.redZoneSize());
  _spillZoneSize = uint8_t(func.spillZoneSize());
  _finalStackAlignment = uint8_t(_naturalStackAlignment);

  if (func.hasFlag(CallConvFlags::kCalleePopsStack)) {
    _calleeStackCleanup = uint16_t(func.argStackSize());
  }

  // Initial masks of dirty and preserved registers.
  for (RegGroup group : RegGroupVirtValues{}) {
    _dirtyRegs[group] = func.usedRegs(group);
    _preservedRegs[group] = func.preservedRegs(group);
  }

  // Exclude stack pointer - this register is never included in saved GP regs.
  _preservedRegs[RegGroup::kGp] &= ~Support::bitMask(archTraits.spRegId());

  // The size and alignment of save/restore area of registers for each virtual register group
  _saveRestoreRegSize = func.callConv()._saveRestoreRegSize;
  _saveRestoreAlignment = func.callConv()._saveRestoreAlignment;

  return kErrorOk;
}